

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O3

ostream * operator<<(ostream *out,skiplist<DictKey,_std::less<DictKey>_> *sl)

{
  uint uVar1;
  char cVar2;
  mapped_type *pmVar3;
  uint *puVar4;
  long lVar5;
  ostream *poVar6;
  uint uVar7;
  int iVar8;
  SLNode<DictKey> *pSVar9;
  int iVar10;
  pointer local_88;
  pointer local_78;
  _Rb_tree<DictKey,_std::pair<const_DictKey,_int>,_std::_Select1st<std::pair<const_DictKey,_int>_>,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
  local_68;
  
  local_78 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_88 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  cVar2 = (char)out;
  if (local_78 != local_88) {
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl._0_8_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    iVar10 = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    pSVar9 = (*local_78)->next;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pSVar9 != (SLNode<DictKey> *)0x0) {
      iVar10 = 0;
      do {
        pmVar3 = std::
                 map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                 ::operator[]((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                               *)&local_68,&pSVar9->val);
        *pmVar3 = iVar10;
        iVar10 = iVar10 + 1;
        pSVar9 = pSVar9->next;
      } while (pSVar9 != (SLNode<DictKey> *)0x0);
      local_78 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_88 = (sl->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    while (local_88 != local_78) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"S",1);
      pSVar9 = local_88[-1];
      local_88 = local_88 + -1;
      uVar7 = 0xffffffff;
      while (pSVar9 = pSVar9->next, pSVar9 != (SLNode<DictKey> *)0x0) {
        puVar4 = (uint *)std::
                         map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                         ::operator[]((map<DictKey,_int,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
                                       *)&local_68,&pSVar9->val);
        uVar1 = *puVar4;
        if (1 < (int)(uVar1 - uVar7)) {
          iVar8 = ~uVar7 + uVar1;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(out,"----",4);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"-",1);
        lVar5 = *(long *)out;
        poVar6 = out + *(long *)(lVar5 + -0x18);
        if (out[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar6);
          poVar6[0xe1] = (ostream)0x1;
          lVar5 = *(long *)out;
        }
        poVar6[0xe0] = (ostream)0x2d;
        *(undefined8 *)(out + *(long *)(lVar5 + -0x18) + 0x10) = 3;
        operator<<(out,&pSVar9->val);
        uVar7 = uVar1;
      }
      if (1 < (int)(iVar10 - uVar7)) {
        iVar8 = (iVar10 + -1) - uVar7;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out,"----",4);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"-E",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    std::
    _Rb_tree<DictKey,_std::pair<const_DictKey,_int>,_std::_Select1st<std::pair<const_DictKey,_int>_>,_std::less<DictKey>,_std::allocator<std::pair<const_DictKey,_int>_>_>
    ::~_Rb_tree(&local_68);
    return out;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"EMPTY SKIPLIST",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar6 = (ostream *)std::ostream::flush();
  return poVar6;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const skiplist<T, X>& sl) {
    if (sl.key.empty()) {
        return out << "EMPTY SKIPLIST" << std::endl;
    }

    // store mapping of node->index in a map
    std::map<T, int> index_store{};
    auto bottom_it = (*(sl.key.begin()))->next;
    int cur_index = 0;
    while (bottom_it) {
        index_store[bottom_it->val] = cur_index;
        cur_index++;
        bottom_it = bottom_it->next;
    }

    auto level = sl.key.rbegin();
    auto end = sl.key.rend();
    while(level != end) {
        // S denotes start of level, could be something different
        out << "S";

        // to store previous element's index
        // and current element's index
        int index = -1, next_index;
        // skip the first element - it is always 0
        auto it = (*level)->next;
        // iterate through the list at this level
        while (it) {
            next_index = index_store[it->val];

            // filler to align it correctly
            // when elements in between don't exist at this level
            for (int i = 1; i < next_index - index; ++i) {
                out << "----";
            }

            // width of printed element is hardcoded to 3 for now
            // the padding is filled with ""-"
            out << "-" << std::setfill('-') << std::setw(3) << it->val;
            it = it->next;

            index = next_index;
        }
        next_index = cur_index;

        for (int i = 1; i < next_index - index; ++i) {
            out << "----";
        }

        out << "-E";

        out << std::endl;

        level++;
    }

    return out;
}